

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ErrorCheckUsingSetCursorPosToExtendParentBoundaries(void)

{
  ImGuiContext *lhs;
  ImVec2 IVar1;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiWindow *rhs;
  
  lhs = GImGui;
  rhs = GImGui->CurrentWindow;
  (rhs->DC).IsSetPos = false;
  IVar1 = ImMax((ImVec2 *)lhs,(ImVec2 *)rhs);
  (rhs->DC).CursorMaxPos = IVar1;
  return;
}

Assistant:

void ImGui::ErrorCheckUsingSetCursorPosToExtendParentBoundaries()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window->DC.IsSetPos);
    window->DC.IsSetPos = false;
#ifdef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    if (window->DC.CursorPos.x <= window->DC.CursorMaxPos.x && window->DC.CursorPos.y <= window->DC.CursorMaxPos.y)
        return;
    if (window->SkipItems)
        return;
    IM_ASSERT(0 && "Code uses SetCursorPos()/SetCursorScreenPos() to extend window/parent boundaries. Please submit an item e.g. Dummy() to validate extent.");
#else
    window->DC.CursorMaxPos = ImMax(window->DC.CursorMaxPos, window->DC.CursorPos);
#endif
}